

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O0

void dradf2(int ido,int l1,float *cc,float *ch,float *wa1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  int local_54;
  int local_50;
  int t6;
  int t5;
  int t4;
  int t3;
  int t2;
  int t1;
  int t0;
  float tr2;
  float ti2;
  int k;
  int i;
  float *wa1_local;
  float *ch_local;
  float *cc_local;
  int l1_local;
  int ido_local;
  
  t3 = 0;
  iVar1 = l1 * ido;
  t4 = iVar1;
  for (tr2 = 0.0; (int)tr2 < l1; tr2 = (float)((int)tr2 + 1)) {
    ch[t3 << 1] = cc[t3] + cc[t4];
    ch[t3 * 2 + ido * 2 + -1] = cc[t3] - cc[t4];
    t3 = ido + t3;
    t4 = ido + t4;
  }
  if (1 < ido) {
    if (ido != 2) {
      t3 = 0;
      t4 = iVar1;
      for (tr2 = 0.0; (int)tr2 < l1; tr2 = (float)((int)tr2 + 1)) {
        t5 = t4;
        local_50 = t3;
        local_54 = t3 * 2;
        t6 = t3 * 2 + ido * 2;
        for (ti2 = 2.8026e-45; (int)ti2 < ido; ti2 = (float)((int)ti2 + 2)) {
          iVar2 = t5 + 2;
          iVar3 = local_50 + 2;
          fVar4 = wa1[(int)ti2 + -2] * cc[t5 + 1] + wa1[(int)ti2 + -1] * cc[iVar2];
          fVar5 = wa1[(int)ti2 + -2] * cc[iVar2] + -(wa1[(int)ti2 + -1] * cc[t5 + 1]);
          ch[local_54 + 2] = cc[iVar3] + fVar5;
          ch[t6 + -2] = fVar5 - cc[iVar3];
          ch[local_54 + 1] = cc[local_50 + 1] + fVar4;
          ch[t6 + -3] = cc[local_50 + 1] - fVar4;
          local_54 = local_54 + 2;
          local_50 = iVar3;
          t6 = t6 + -2;
          t5 = iVar2;
        }
        t3 = ido + t3;
        t4 = ido + t4;
      }
      if (ido % 2 == 1) {
        return;
      }
    }
    t5 = ido + -1;
    t4 = iVar1 + t5;
    t3 = ido;
    for (tr2 = 0.0; (int)tr2 < l1; tr2 = (float)((int)tr2 + 1)) {
      ch[t3] = -cc[t4];
      ch[t3 + -1] = cc[t5];
      t3 = ido * 2 + t3;
      t4 = ido + t4;
      t5 = ido + t5;
    }
  }
  return;
}

Assistant:

static void dradf2(int ido,int l1,float *cc,float *ch,float *wa1){
  int i,k;
  float ti2,tr2;
  int t0,t1,t2,t3,t4,t5,t6;

  t1=0;
  t0=(t2=l1*ido);
  t3=ido<<1;
  for(k=0;k<l1;k++){
    ch[t1<<1]=cc[t1]+cc[t2];
    ch[(t1<<1)+t3-1]=cc[t1]-cc[t2];
    t1+=ido;
    t2+=ido;
  }

  if(ido<2)return;
  if(ido==2)goto L105;

  t1=0;
  t2=t0;
  for(k=0;k<l1;k++){
    t3=t2;
    t4=(t1<<1)+(ido<<1);
    t5=t1;
    t6=t1+t1;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4-=2;
      t5+=2;
      t6+=2;
      tr2=wa1[i-2]*cc[t3-1]+wa1[i-1]*cc[t3];
      ti2=wa1[i-2]*cc[t3]-wa1[i-1]*cc[t3-1];
      ch[t6]=cc[t5]+ti2;
      ch[t4]=ti2-cc[t5];
      ch[t6-1]=cc[t5-1]+tr2;
      ch[t4-1]=cc[t5-1]-tr2;
    }
    t1+=ido;
    t2+=ido;
  }

  if(ido%2==1)return;

 L105:
  t3=(t2=(t1=ido)-1);
  t2+=t0;
  for(k=0;k<l1;k++){
    ch[t1]=-cc[t2];
    ch[t1-1]=cc[t3];
    t1+=ido<<1;
    t2+=ido;
    t3+=ido;
  }
}